

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Postprocess.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::Postprocess_BuildMesh
          (X3DImporter *this,CX3DImporter_NodeElement *pNodeElement,aiMesh **pMesh)

{
  _List_node_base *p_Var1;
  bool bVar2;
  DeadlyImportError *pDVar3;
  size_type sVar4;
  reference paVar5;
  aiMesh *paVar6;
  reference ppCVar7;
  reference paVar8;
  _List_node_base *p_Var9;
  string local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  undefined1 local_651;
  string local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  _Self local_5f0;
  _Self local_5e8;
  iterator ch_it_16;
  _Self local_5d8;
  iterator ch_it_15;
  CX3DImporter_NodeElement_Set *tnemesh_11;
  string local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  _Self local_560;
  _Self local_558;
  iterator ch_it_14;
  _List_const_iterator<aiVector3t<float>_> local_548;
  iterator local_540;
  _List_const_iterator<aiVector3t<float>_> local_538;
  const_iterator it_3;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vec_copy_1;
  _Self local_510;
  iterator ch_it_13;
  CX3DImporter_NodeElement_Set *tnemesh_10;
  string local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  _Self local_498;
  _Self local_490;
  iterator ch_it_12;
  _Self local_480;
  iterator ch_it_11;
  CX3DImporter_NodeElement_Set *tnemesh_9;
  string local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  _Self local_408;
  _Self local_400;
  iterator ch_it_10;
  _Self local_3f0;
  iterator ch_it_9;
  CX3DImporter_NodeElement_Set *tnemesh_8;
  string local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  _Self local_378;
  _Self local_370;
  iterator ch_it_8;
  _List_const_iterator<aiVector3t<float>_> local_360;
  iterator local_358;
  _List_const_iterator<aiVector3t<float>_> local_350;
  const_iterator it_2;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vec_copy;
  _Self local_328;
  iterator ch_it_7;
  CX3DImporter_NodeElement_Set *tnemesh_7;
  CX3DImporter_NodeElement_IndexedSet *tnemesh_6;
  string local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  _Self local_2a8;
  _Self local_2a0;
  iterator ch_it_6;
  _Self local_290;
  iterator ch_it_5;
  CX3DImporter_NodeElement_IndexedSet *tnemesh_5;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  _Self local_218;
  _Self local_210;
  iterator ch_it_4;
  _Self local_200;
  iterator ch_it_3;
  CX3DImporter_NodeElement_IndexedSet *tnemesh_4;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  _Self local_188;
  _Self local_180;
  iterator ch_it_2;
  _Self local_170;
  iterator ch_it_1;
  CX3DImporter_NodeElement_IndexedSet *tnemesh_3;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  _Self local_f8;
  _Self local_f0;
  iterator ch_it;
  CX3DImporter_NodeElement_ElevationGrid *tnemesh_2;
  _Self local_d8;
  iterator it_1;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tarr_1;
  CX3DImporter_NodeElement_Geometry3D *tnemesh_1;
  _Self local_a8;
  iterator it;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tarr;
  CX3DImporter_NodeElement_Geometry2D *tnemesh;
  string local_78;
  undefined1 local_55;
  allocator local_41;
  string local_40;
  aiMesh **local_20;
  aiMesh **pMesh_local;
  CX3DImporter_NodeElement *pNodeElement_local;
  X3DImporter *this_local;
  
  local_20 = pMesh;
  pMesh_local = (aiMesh **)pNodeElement;
  pNodeElement_local = (CX3DImporter_NodeElement *)this;
  if (pMesh == (aiMesh **)0x0) {
    local_55 = 1;
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"Postprocess_BuildMesh. pMesh is nullptr.",&local_41);
    DeadlyImportError::DeadlyImportError(pDVar3,&local_40);
    local_55 = 0;
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  if (*pMesh == (aiMesh *)0x0) {
    if (((((pNodeElement->Type == ENET_Arc2D) || (pNodeElement->Type == ENET_ArcClose2D)) ||
         (pNodeElement->Type == ENET_Circle2D)) ||
        ((pNodeElement->Type == ENET_Disk2D || (pNodeElement->Type == ENET_Polyline2D)))) ||
       ((pNodeElement->Type == ENET_Polypoint2D ||
        ((pNodeElement->Type == ENET_Rectangle2D || (pNodeElement->Type == ENET_TriangleSet2D))))))
    {
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&it);
      sVar4 = std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                        ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                         (pNodeElement + 1));
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&it,sVar4);
      local_a8._M_node =
           (_List_node_base *)
           std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                     ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                      (pNodeElement + 1));
      while( true ) {
        tnemesh_1 = (CX3DImporter_NodeElement_Geometry3D *)
                    std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end
                              ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               (pNodeElement + 1));
        bVar2 = std::operator!=(&local_a8,(_Self *)&tnemesh_1);
        if (!bVar2) break;
        paVar5 = std::_List_iterator<aiVector3t<float>_>::operator*(&local_a8);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&it,paVar5);
        std::_List_iterator<aiVector3t<float>_>::operator++(&local_a8);
      }
      paVar6 = StandardShapes::MakeMesh
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&it,
                          (uint)pNodeElement[1].ID._M_string_length);
      *local_20 = paVar6;
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&it);
    }
    else if ((((pNodeElement->Type == ENET_Box) || (pNodeElement->Type == ENET_Cone)) ||
             (pNodeElement->Type == ENET_Cylinder)) || (pNodeElement->Type == ENET_Sphere)) {
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&it_1);
      sVar4 = std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                        ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                         (pNodeElement + 1));
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&it_1,sVar4);
      local_d8._M_node =
           (_List_node_base *)
           std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                     ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                      (pNodeElement + 1));
      while( true ) {
        tnemesh_2 = (CX3DImporter_NodeElement_ElevationGrid *)
                    std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end
                              ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               (pNodeElement + 1));
        bVar2 = std::operator!=(&local_d8,(_Self *)&tnemesh_2);
        if (!bVar2) break;
        paVar5 = std::_List_iterator<aiVector3t<float>_>::operator*(&local_d8);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&it_1,paVar5);
        std::_List_iterator<aiVector3t<float>_>::operator++(&local_d8);
      }
      paVar6 = StandardShapes::MakeMesh
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&it_1,
                          (uint)pNodeElement[1].ID._M_string_length);
      *local_20 = paVar6;
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&it_1);
    }
    else if (pNodeElement->Type == ENET_ElevationGrid) {
      ch_it._M_node = (_List_node_base *)pNodeElement;
      paVar6 = GeometryHelper_MakeMesh
                         (this,(vector<int,_std::allocator<int>_> *)
                               ((long)&pNodeElement[1].ID.field_2 + 8),
                          (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                          (pNodeElement + 1));
      *local_20 = paVar6;
      local_f0._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::begin
                     ((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                       *)&ch_it._M_node[3]._M_prev);
      while( true ) {
        local_f8._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::end
                       ((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                         *)&ch_it._M_node[3]._M_prev);
        bVar2 = std::operator!=(&local_f0,&local_f8);
        if (!bVar2) break;
        ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_f0);
        if ((*ppCVar7)->Type == ENET_Color) {
          paVar6 = *local_20;
          ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_f0);
          MeshGeometry_AddColor
                    (this,paVar6,(list<aiColor3D,_std::allocator<aiColor3D>_> *)(*ppCVar7 + 1),
                     (bool)(*(byte *)((long)&ch_it._M_node[7]._M_next + 2) & 1));
        }
        else {
          ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_f0);
          if ((*ppCVar7)->Type == ENET_ColorRGBA) {
            paVar6 = *local_20;
            ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_f0);
            MeshGeometry_AddColor
                      (this,paVar6,
                       (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(*ppCVar7 + 1),
                       (bool)(*(byte *)((long)&ch_it._M_node[7]._M_next + 2) & 1));
          }
          else {
            ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_f0);
            if ((*ppCVar7)->Type == ENET_Normal) {
              paVar6 = *local_20;
              ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_f0);
              MeshGeometry_AddNormal
                        (this,paVar6,
                         (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                         (*ppCVar7 + 1),(bool)(*(byte *)((long)&ch_it._M_node[7]._M_next + 1) & 1));
            }
            else {
              ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_f0);
              if ((*ppCVar7)->Type != ENET_TextureCoordinate) {
                pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
                ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_f0);
                to_string<CX3DImporter_NodeElement::EType>(&local_158,(*ppCVar7)->Type);
                std::operator+(&local_138,"Postprocess_BuildMesh. Unknown child of ElevationGrid: ",
                               &local_158);
                std::operator+(&local_118,&local_138,".");
                DeadlyImportError::DeadlyImportError(pDVar3,&local_118);
                __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,
                            DeadlyImportError::~DeadlyImportError);
              }
              paVar6 = *local_20;
              ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_f0);
              MeshGeometry_AddTexCoord
                        (this,paVar6,
                         (list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                         (*ppCVar7 + 1));
            }
          }
        }
        std::_List_iterator<CX3DImporter_NodeElement_*>::operator++(&local_f0);
      }
    }
    else if (pNodeElement->Type == ENET_IndexedFaceSet) {
      ch_it_1._M_node = (_List_node_base *)pNodeElement;
      local_170._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::begin
                     (&pNodeElement->Child);
      while( true ) {
        ch_it_2 = std::__cxx11::
                  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::end
                            ((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                              *)&ch_it_1._M_node[3]._M_prev);
        bVar2 = std::operator!=(&local_170,&ch_it_2);
        if (!bVar2) break;
        ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_170);
        if ((*ppCVar7)->Type == ENET_Coordinate) {
          p_Var1 = ch_it_1._M_node + 9;
          ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_170);
          paVar6 = GeometryHelper_MakeMesh
                             (this,(vector<int,_std::allocator<int>_> *)&p_Var1->_M_prev,
                              (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                              (*ppCVar7 + 1));
          *local_20 = paVar6;
        }
        std::_List_iterator<CX3DImporter_NodeElement_*>::operator++(&local_170);
      }
      local_180._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::begin
                     ((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                       *)&ch_it_1._M_node[3]._M_prev);
      while( true ) {
        local_188._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::end
                       ((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                         *)&ch_it_1._M_node[3]._M_prev);
        bVar2 = std::operator!=(&local_180,&local_188);
        if (!bVar2) break;
        ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_180);
        if ((*ppCVar7)->Type == ENET_Color) {
          paVar6 = *local_20;
          p_Var1 = ch_it_1._M_node + 9;
          p_Var9 = ch_it_1._M_node + 7;
          ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_180);
          MeshGeometry_AddColor
                    (this,paVar6,(vector<int,_std::allocator<int>_> *)&p_Var1->_M_prev,
                     (vector<int,_std::allocator<int>_> *)&p_Var9->_M_prev,
                     (list<aiColor3D,_std::allocator<aiColor3D>_> *)(*ppCVar7 + 1),
                     (bool)(*(byte *)&ch_it_1._M_node[9]._M_next & 1));
        }
        else {
          ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_180);
          if ((*ppCVar7)->Type == ENET_ColorRGBA) {
            paVar6 = *local_20;
            p_Var1 = ch_it_1._M_node + 9;
            p_Var9 = ch_it_1._M_node + 7;
            ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_180);
            MeshGeometry_AddColor
                      (this,paVar6,(vector<int,_std::allocator<int>_> *)&p_Var1->_M_prev,
                       (vector<int,_std::allocator<int>_> *)&p_Var9->_M_prev,
                       (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(*ppCVar7 + 1),
                       (bool)(*(byte *)&ch_it_1._M_node[9]._M_next & 1));
          }
          else {
            ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_180);
            if ((*ppCVar7)->Type != ENET_Coordinate) {
              ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_180);
              if ((*ppCVar7)->Type == ENET_Normal) {
                paVar6 = *local_20;
                p_Var1 = ch_it_1._M_node + 9;
                p_Var9 = ch_it_1._M_node + 0xb;
                ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_180);
                MeshGeometry_AddNormal
                          (this,paVar6,(vector<int,_std::allocator<int>_> *)&p_Var1->_M_prev,
                           (vector<int,_std::allocator<int>_> *)&p_Var9->_M_prev,
                           (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                           (*ppCVar7 + 1),(bool)(*(byte *)&ch_it_1._M_node[0xd]._M_next & 1));
              }
              else {
                ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_180);
                if ((*ppCVar7)->Type != ENET_TextureCoordinate) {
                  pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
                  ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_180);
                  to_string<CX3DImporter_NodeElement::EType>(&local_1e8,(*ppCVar7)->Type);
                  std::operator+(&local_1c8,
                                 "Postprocess_BuildMesh. Unknown child of IndexedFaceSet: ",
                                 &local_1e8);
                  std::operator+(&local_1a8,&local_1c8,".");
                  DeadlyImportError::DeadlyImportError(pDVar3,&local_1a8);
                  __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,
                              DeadlyImportError::~DeadlyImportError);
                }
                paVar6 = *local_20;
                p_Var1 = ch_it_1._M_node + 9;
                p_Var9 = ch_it_1._M_node + 0xd;
                ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_180);
                MeshGeometry_AddTexCoord
                          (this,paVar6,(vector<int,_std::allocator<int>_> *)&p_Var1->_M_prev,
                           (vector<int,_std::allocator<int>_> *)&p_Var9->_M_prev,
                           (list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                           (*ppCVar7 + 1));
              }
            }
          }
        }
        std::_List_iterator<CX3DImporter_NodeElement_*>::operator++(&local_180);
      }
    }
    else if (pNodeElement->Type == ENET_IndexedLineSet) {
      ch_it_3._M_node = (_List_node_base *)pNodeElement;
      local_200._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::begin
                     (&pNodeElement->Child);
      while( true ) {
        ch_it_4 = std::__cxx11::
                  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::end
                            ((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                              *)&ch_it_3._M_node[3]._M_prev);
        bVar2 = std::operator!=(&local_200,&ch_it_4);
        if (!bVar2) break;
        ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_200);
        if ((*ppCVar7)->Type == ENET_Coordinate) {
          p_Var1 = ch_it_3._M_node + 9;
          ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_200);
          paVar6 = GeometryHelper_MakeMesh
                             (this,(vector<int,_std::allocator<int>_> *)&p_Var1->_M_prev,
                              (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                              (*ppCVar7 + 1));
          *local_20 = paVar6;
        }
        std::_List_iterator<CX3DImporter_NodeElement_*>::operator++(&local_200);
      }
      local_210._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::begin
                     ((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                       *)&ch_it_3._M_node[3]._M_prev);
      while( true ) {
        local_218._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::end
                       ((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                         *)&ch_it_3._M_node[3]._M_prev);
        bVar2 = std::operator!=(&local_210,&local_218);
        if (!bVar2) break;
        if (*local_20 == (aiMesh *)0x0) {
          __assert_fail("*pMesh",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/X3D/X3DImporter_Postprocess.cpp"
                        ,0x16a,
                        "void Assimp::X3DImporter::Postprocess_BuildMesh(const CX3DImporter_NodeElement &, aiMesh **) const"
                       );
        }
        ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_210);
        if ((*ppCVar7)->Type == ENET_Color) {
          paVar6 = *local_20;
          p_Var1 = ch_it_3._M_node + 9;
          p_Var9 = ch_it_3._M_node + 7;
          ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_210);
          MeshGeometry_AddColor
                    (this,paVar6,(vector<int,_std::allocator<int>_> *)&p_Var1->_M_prev,
                     (vector<int,_std::allocator<int>_> *)&p_Var9->_M_prev,
                     (list<aiColor3D,_std::allocator<aiColor3D>_> *)(*ppCVar7 + 1),
                     (bool)(*(byte *)&ch_it_3._M_node[9]._M_next & 1));
        }
        else {
          ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_210);
          if ((*ppCVar7)->Type == ENET_ColorRGBA) {
            paVar6 = *local_20;
            p_Var1 = ch_it_3._M_node + 9;
            p_Var9 = ch_it_3._M_node + 7;
            ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_210);
            MeshGeometry_AddColor
                      (this,paVar6,(vector<int,_std::allocator<int>_> *)&p_Var1->_M_prev,
                       (vector<int,_std::allocator<int>_> *)&p_Var9->_M_prev,
                       (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(*ppCVar7 + 1),
                       (bool)(*(byte *)&ch_it_3._M_node[9]._M_next & 1));
          }
          else {
            ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_210);
            if ((*ppCVar7)->Type != ENET_Coordinate) {
              pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_210);
              to_string<CX3DImporter_NodeElement::EType>(&local_278,(*ppCVar7)->Type);
              std::operator+(&local_258,"Postprocess_BuildMesh. Unknown child of IndexedLineSet: ",
                             &local_278);
              std::operator+(&local_238,&local_258,".");
              DeadlyImportError::DeadlyImportError(pDVar3,&local_238);
              __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError)
              ;
            }
          }
        }
        std::_List_iterator<CX3DImporter_NodeElement_*>::operator++(&local_210);
      }
    }
    else if (((pNodeElement->Type == ENET_IndexedTriangleSet) ||
             (pNodeElement->Type == ENET_IndexedTriangleFanSet)) ||
            (pNodeElement->Type == ENET_IndexedTriangleStripSet)) {
      ch_it_5._M_node = (_List_node_base *)pNodeElement;
      local_290._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::begin
                     (&pNodeElement->Child);
      while( true ) {
        ch_it_6 = std::__cxx11::
                  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::end
                            ((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                              *)&ch_it_5._M_node[3]._M_prev);
        bVar2 = std::operator!=(&local_290,&ch_it_6);
        if (!bVar2) break;
        ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_290);
        if ((*ppCVar7)->Type == ENET_Coordinate) {
          p_Var1 = ch_it_5._M_node + 9;
          ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_290);
          paVar6 = GeometryHelper_MakeMesh
                             (this,(vector<int,_std::allocator<int>_> *)&p_Var1->_M_prev,
                              (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                              (*ppCVar7 + 1));
          *local_20 = paVar6;
        }
        std::_List_iterator<CX3DImporter_NodeElement_*>::operator++(&local_290);
      }
      local_2a0._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::begin
                     ((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                       *)&ch_it_5._M_node[3]._M_prev);
      while( true ) {
        local_2a8._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::end
                       ((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                         *)&ch_it_5._M_node[3]._M_prev);
        bVar2 = std::operator!=(&local_2a0,&local_2a8);
        if (!bVar2) break;
        if (*local_20 == (aiMesh *)0x0) {
          __assert_fail("*pMesh",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/X3D/X3DImporter_Postprocess.cpp"
                        ,0x18b,
                        "void Assimp::X3DImporter::Postprocess_BuildMesh(const CX3DImporter_NodeElement &, aiMesh **) const"
                       );
        }
        ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_2a0);
        if ((*ppCVar7)->Type == ENET_Color) {
          paVar6 = *local_20;
          p_Var1 = ch_it_5._M_node + 9;
          p_Var9 = ch_it_5._M_node + 7;
          ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_2a0);
          MeshGeometry_AddColor
                    (this,paVar6,(vector<int,_std::allocator<int>_> *)&p_Var1->_M_prev,
                     (vector<int,_std::allocator<int>_> *)&p_Var9->_M_prev,
                     (list<aiColor3D,_std::allocator<aiColor3D>_> *)(*ppCVar7 + 1),
                     (bool)(*(byte *)&ch_it_5._M_node[9]._M_next & 1));
        }
        else {
          ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_2a0);
          if ((*ppCVar7)->Type == ENET_ColorRGBA) {
            paVar6 = *local_20;
            p_Var1 = ch_it_5._M_node + 9;
            p_Var9 = ch_it_5._M_node + 7;
            ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_2a0);
            MeshGeometry_AddColor
                      (this,paVar6,(vector<int,_std::allocator<int>_> *)&p_Var1->_M_prev,
                       (vector<int,_std::allocator<int>_> *)&p_Var9->_M_prev,
                       (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(*ppCVar7 + 1),
                       (bool)(*(byte *)&ch_it_5._M_node[9]._M_next & 1));
          }
          else {
            ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_2a0);
            if ((*ppCVar7)->Type != ENET_Coordinate) {
              ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_2a0);
              if ((*ppCVar7)->Type == ENET_Normal) {
                paVar6 = *local_20;
                p_Var1 = ch_it_5._M_node + 9;
                p_Var9 = ch_it_5._M_node + 0xb;
                ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_2a0);
                MeshGeometry_AddNormal
                          (this,paVar6,(vector<int,_std::allocator<int>_> *)&p_Var1->_M_prev,
                           (vector<int,_std::allocator<int>_> *)&p_Var9->_M_prev,
                           (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                           (*ppCVar7 + 1),(bool)(*(byte *)&ch_it_5._M_node[0xd]._M_next & 1));
              }
              else {
                ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_2a0);
                if ((*ppCVar7)->Type != ENET_TextureCoordinate) {
                  pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
                  ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_2a0);
                  to_string<CX3DImporter_NodeElement::EType>(&local_308,(*ppCVar7)->Type);
                  std::operator+(&local_2e8,
                                 "Postprocess_BuildMesh. Unknown child of IndexedTriangleSet or IndexedTriangleFanSet, or \t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\tIndexedTriangleStripSet: "
                                 ,&local_308);
                  std::operator+(&local_2c8,&local_2e8,".");
                  DeadlyImportError::DeadlyImportError(pDVar3,&local_2c8);
                  __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,
                              DeadlyImportError::~DeadlyImportError);
                }
                paVar6 = *local_20;
                p_Var1 = ch_it_5._M_node + 9;
                p_Var9 = ch_it_5._M_node + 0xd;
                ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_2a0);
                MeshGeometry_AddTexCoord
                          (this,paVar6,(vector<int,_std::allocator<int>_> *)&p_Var1->_M_prev,
                           (vector<int,_std::allocator<int>_> *)&p_Var9->_M_prev,
                           (list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                           (*ppCVar7 + 1));
              }
            }
          }
        }
        std::_List_iterator<CX3DImporter_NodeElement_*>::operator++(&local_2a0);
      }
    }
    else if (pNodeElement->Type == ENET_Extrusion) {
      paVar6 = GeometryHelper_MakeMesh
                         (this,(vector<int,_std::allocator<int>_> *)
                               &pNodeElement[1].Child.
                                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                                ._M_impl._M_node._M_size,
                          (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                          (pNodeElement + 1));
      *local_20 = paVar6;
    }
    else if (pNodeElement->Type == ENET_PointSet) {
      ch_it_7._M_node = (_List_node_base *)pNodeElement;
      local_328._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::begin
                     (&pNodeElement->Child);
      while( true ) {
        vec_copy.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::__cxx11::
                      list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                      ::end((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                             *)&ch_it_7._M_node[3]._M_prev);
        bVar2 = std::operator!=(&local_328,
                                (_Self *)&vec_copy.
                                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (!bVar2) break;
        ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_328);
        if ((*ppCVar7)->Type == ENET_Coordinate) {
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&it_2);
          ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_328);
          sVar4 = std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                            ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                             (*ppCVar7 + 1));
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&it_2,sVar4);
          ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_328);
          local_358._M_node =
               (_List_node_base *)
               std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                         ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                          (*ppCVar7 + 1));
          std::_List_const_iterator<aiVector3t<float>_>::_List_const_iterator(&local_350,&local_358)
          ;
          while( true ) {
            ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_328);
            ch_it_8._M_node =
                 (_List_node_base *)
                 std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end
                           ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            (*ppCVar7 + 1));
            std::_List_const_iterator<aiVector3t<float>_>::_List_const_iterator
                      (&local_360,(iterator *)&ch_it_8);
            bVar2 = std::operator!=(&local_350,&local_360);
            if (!bVar2) break;
            paVar8 = std::_List_const_iterator<aiVector3t<float>_>::operator*(&local_350);
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                      ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&it_2,
                       paVar8);
            std::_List_const_iterator<aiVector3t<float>_>::operator++(&local_350);
          }
          paVar6 = StandardShapes::MakeMesh
                             ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                              &it_2,1);
          *local_20 = paVar6;
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&it_2);
        }
        std::_List_iterator<CX3DImporter_NodeElement_*>::operator++(&local_328);
      }
      local_370._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::begin
                     ((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                       *)&ch_it_7._M_node[3]._M_prev);
      while( true ) {
        local_378._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::end
                       ((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                         *)&ch_it_7._M_node[3]._M_prev);
        bVar2 = std::operator!=(&local_370,&local_378);
        if (!bVar2) break;
        if (*local_20 == (aiMesh *)0x0) {
          __assert_fail("*pMesh",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/X3D/X3DImporter_Postprocess.cpp"
                        ,0x1c5,
                        "void Assimp::X3DImporter::Postprocess_BuildMesh(const CX3DImporter_NodeElement &, aiMesh **) const"
                       );
        }
        ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_370);
        if ((*ppCVar7)->Type == ENET_Color) {
          paVar6 = *local_20;
          ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_370);
          MeshGeometry_AddColor
                    (this,paVar6,(list<aiColor3D,_std::allocator<aiColor3D>_> *)(*ppCVar7 + 1),true)
          ;
        }
        else {
          ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_370);
          if ((*ppCVar7)->Type == ENET_ColorRGBA) {
            paVar6 = *local_20;
            ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_370);
            MeshGeometry_AddColor
                      (this,paVar6,
                       (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(*ppCVar7 + 1),
                       true);
          }
          else {
            ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_370);
            if ((*ppCVar7)->Type != ENET_Coordinate) {
              pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_370);
              to_string<CX3DImporter_NodeElement::EType>(&local_3d8,(*ppCVar7)->Type);
              std::operator+(&local_3b8,"Postprocess_BuildMesh. Unknown child of PointSet: ",
                             &local_3d8);
              std::operator+(&local_398,&local_3b8,".");
              DeadlyImportError::DeadlyImportError(pDVar3,&local_398);
              __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError)
              ;
            }
          }
        }
        std::_List_iterator<CX3DImporter_NodeElement_*>::operator++(&local_370);
      }
    }
    else if (pNodeElement->Type == ENET_LineSet) {
      ch_it_9._M_node = (_List_node_base *)pNodeElement;
      local_3f0._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::begin
                     (&pNodeElement->Child);
      while( true ) {
        ch_it_10 = std::__cxx11::
                   list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
                   end((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                        *)&ch_it_9._M_node[3]._M_prev);
        bVar2 = std::operator!=(&local_3f0,&ch_it_10);
        if (!bVar2) break;
        ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_3f0);
        if ((*ppCVar7)->Type == ENET_Coordinate) {
          p_Var1 = ch_it_9._M_node + 7;
          ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_3f0);
          paVar6 = GeometryHelper_MakeMesh
                             (this,(vector<int,_std::allocator<int>_> *)&p_Var1->_M_prev,
                              (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                              (*ppCVar7 + 1));
          *local_20 = paVar6;
        }
        std::_List_iterator<CX3DImporter_NodeElement_*>::operator++(&local_3f0);
      }
      local_400._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::begin
                     ((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                       *)&ch_it_9._M_node[3]._M_prev);
      while( true ) {
        local_408._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::end
                       ((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                         *)&ch_it_9._M_node[3]._M_prev);
        bVar2 = std::operator!=(&local_400,&local_408);
        if (!bVar2) break;
        if (*local_20 == (aiMesh *)0x0) {
          __assert_fail("*pMesh",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/X3D/X3DImporter_Postprocess.cpp"
                        ,0x1e3,
                        "void Assimp::X3DImporter::Postprocess_BuildMesh(const CX3DImporter_NodeElement &, aiMesh **) const"
                       );
        }
        ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_400);
        if ((*ppCVar7)->Type == ENET_Color) {
          paVar6 = *local_20;
          ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_400);
          MeshGeometry_AddColor
                    (this,paVar6,(list<aiColor3D,_std::allocator<aiColor3D>_> *)(*ppCVar7 + 1),true)
          ;
        }
        else {
          ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_400);
          if ((*ppCVar7)->Type == ENET_ColorRGBA) {
            paVar6 = *local_20;
            ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_400);
            MeshGeometry_AddColor
                      (this,paVar6,
                       (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(*ppCVar7 + 1),
                       true);
          }
          else {
            ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_400);
            if ((*ppCVar7)->Type != ENET_Coordinate) {
              pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_400);
              to_string<CX3DImporter_NodeElement::EType>(&local_468,(*ppCVar7)->Type);
              std::operator+(&local_448,"Postprocess_BuildMesh. Unknown child of LineSet: ",
                             &local_468);
              std::operator+(&local_428,&local_448,".");
              DeadlyImportError::DeadlyImportError(pDVar3,&local_428);
              __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError)
              ;
            }
          }
        }
        std::_List_iterator<CX3DImporter_NodeElement_*>::operator++(&local_400);
      }
    }
    else if (pNodeElement->Type == ENET_TriangleFanSet) {
      ch_it_11._M_node = (_List_node_base *)pNodeElement;
      local_480._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::begin
                     (&pNodeElement->Child);
      while( true ) {
        ch_it_12 = std::__cxx11::
                   list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
                   end((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                        *)&ch_it_11._M_node[3]._M_prev);
        bVar2 = std::operator!=(&local_480,&ch_it_12);
        if (!bVar2) break;
        ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_480);
        if ((*ppCVar7)->Type == ENET_Coordinate) {
          p_Var1 = ch_it_11._M_node + 7;
          ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_480);
          paVar6 = GeometryHelper_MakeMesh
                             (this,(vector<int,_std::allocator<int>_> *)&p_Var1->_M_prev,
                              (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                              (*ppCVar7 + 1));
          *local_20 = paVar6;
        }
        std::_List_iterator<CX3DImporter_NodeElement_*>::operator++(&local_480);
      }
      local_490._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::begin
                     ((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                       *)&ch_it_11._M_node[3]._M_prev);
      while( true ) {
        local_498._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::end
                       ((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                         *)&ch_it_11._M_node[3]._M_prev);
        bVar2 = std::operator!=(&local_490,&local_498);
        if ((!bVar2) || (*local_20 == (aiMesh *)0x0)) break;
        ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_490);
        if ((*ppCVar7)->Type == ENET_Color) {
          paVar6 = *local_20;
          ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_490);
          MeshGeometry_AddColor
                    (this,paVar6,(list<aiColor3D,_std::allocator<aiColor3D>_> *)(*ppCVar7 + 1),
                     (bool)(*(byte *)((long)&ch_it_11._M_node[7]._M_next + 2) & 1));
        }
        else {
          ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_490);
          if ((*ppCVar7)->Type == ENET_ColorRGBA) {
            paVar6 = *local_20;
            ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_490);
            MeshGeometry_AddColor
                      (this,paVar6,
                       (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(*ppCVar7 + 1),
                       (bool)(*(byte *)((long)&ch_it_11._M_node[7]._M_next + 2) & 1));
          }
          else {
            ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_490);
            if ((*ppCVar7)->Type != ENET_Coordinate) {
              ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_490);
              if ((*ppCVar7)->Type == ENET_Normal) {
                paVar6 = *local_20;
                p_Var1 = ch_it_11._M_node + 7;
                p_Var9 = ch_it_11._M_node + 9;
                ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_490);
                MeshGeometry_AddNormal
                          (this,paVar6,(vector<int,_std::allocator<int>_> *)&p_Var1->_M_prev,
                           (vector<int,_std::allocator<int>_> *)p_Var9,
                           (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                           (*ppCVar7 + 1),
                           (bool)(*(byte *)((long)&ch_it_11._M_node[7]._M_next + 3) & 1));
              }
              else {
                ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_490);
                if ((*ppCVar7)->Type != ENET_TextureCoordinate) {
                  pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
                  ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_490);
                  to_string<CX3DImporter_NodeElement::EType>(&local_4f8,(*ppCVar7)->Type);
                  std::operator+(&local_4d8,
                                 "Postprocess_BuildMesh. Unknown child of TrianlgeFanSet: ",
                                 &local_4f8);
                  std::operator+(&local_4b8,&local_4d8,".");
                  DeadlyImportError::DeadlyImportError(pDVar3,&local_4b8);
                  __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,
                              DeadlyImportError::~DeadlyImportError);
                }
                paVar6 = *local_20;
                p_Var1 = ch_it_11._M_node + 7;
                p_Var9 = ch_it_11._M_node + 10;
                ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_490);
                MeshGeometry_AddTexCoord
                          (this,paVar6,(vector<int,_std::allocator<int>_> *)&p_Var1->_M_prev,
                           (vector<int,_std::allocator<int>_> *)&p_Var9->_M_prev,
                           (list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                           (*ppCVar7 + 1));
              }
            }
          }
        }
        std::_List_iterator<CX3DImporter_NodeElement_*>::operator++(&local_490);
      }
    }
    else if (pNodeElement->Type == ENET_TriangleSet) {
      ch_it_13._M_node = (_List_node_base *)pNodeElement;
      local_510._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::begin
                     (&pNodeElement->Child);
      while( true ) {
        vec_copy_1.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::__cxx11::
                      list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                      ::end((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                             *)&ch_it_13._M_node[3]._M_prev);
        bVar2 = std::operator!=(&local_510,
                                (_Self *)&vec_copy_1.
                                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (!bVar2) break;
        ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_510);
        if ((*ppCVar7)->Type == ENET_Coordinate) {
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&it_3);
          ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_510);
          sVar4 = std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                            ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                             (*ppCVar7 + 1));
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&it_3,sVar4);
          ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_510);
          local_540._M_node =
               (_List_node_base *)
               std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                         ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                          (*ppCVar7 + 1));
          std::_List_const_iterator<aiVector3t<float>_>::_List_const_iterator(&local_538,&local_540)
          ;
          while( true ) {
            ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_510);
            ch_it_14._M_node =
                 (_List_node_base *)
                 std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end
                           ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            (*ppCVar7 + 1));
            std::_List_const_iterator<aiVector3t<float>_>::_List_const_iterator
                      (&local_548,(iterator *)&ch_it_14);
            bVar2 = std::operator!=(&local_538,&local_548);
            if (!bVar2) break;
            paVar8 = std::_List_const_iterator<aiVector3t<float>_>::operator*(&local_538);
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                      ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&it_3,
                       paVar8);
            std::_List_const_iterator<aiVector3t<float>_>::operator++(&local_538);
          }
          paVar6 = StandardShapes::MakeMesh
                             ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                              &it_3,3);
          *local_20 = paVar6;
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&it_3);
        }
        std::_List_iterator<CX3DImporter_NodeElement_*>::operator++(&local_510);
      }
      local_558._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::begin
                     ((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                       *)&ch_it_13._M_node[3]._M_prev);
      while( true ) {
        local_560._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::end
                       ((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                         *)&ch_it_13._M_node[3]._M_prev);
        bVar2 = std::operator!=(&local_558,&local_560);
        if (!bVar2) break;
        if (*local_20 == (aiMesh *)0x0) {
          __assert_fail("*pMesh",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/X3D/X3DImporter_Postprocess.cpp"
                        ,0x22f,
                        "void Assimp::X3DImporter::Postprocess_BuildMesh(const CX3DImporter_NodeElement &, aiMesh **) const"
                       );
        }
        ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_558);
        if ((*ppCVar7)->Type == ENET_Color) {
          paVar6 = *local_20;
          ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_558);
          MeshGeometry_AddColor
                    (this,paVar6,(list<aiColor3D,_std::allocator<aiColor3D>_> *)(*ppCVar7 + 1),
                     (bool)(*(byte *)((long)&ch_it_13._M_node[7]._M_next + 2) & 1));
        }
        else {
          ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_558);
          if ((*ppCVar7)->Type == ENET_ColorRGBA) {
            paVar6 = *local_20;
            ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_558);
            MeshGeometry_AddColor
                      (this,paVar6,
                       (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(*ppCVar7 + 1),
                       (bool)(*(byte *)((long)&ch_it_13._M_node[7]._M_next + 2) & 1));
          }
          else {
            ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_558);
            if ((*ppCVar7)->Type != ENET_Coordinate) {
              ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_558);
              if ((*ppCVar7)->Type == ENET_Normal) {
                paVar6 = *local_20;
                p_Var1 = ch_it_13._M_node + 7;
                p_Var9 = ch_it_13._M_node + 9;
                ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_558);
                MeshGeometry_AddNormal
                          (this,paVar6,(vector<int,_std::allocator<int>_> *)&p_Var1->_M_prev,
                           (vector<int,_std::allocator<int>_> *)p_Var9,
                           (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                           (*ppCVar7 + 1),
                           (bool)(*(byte *)((long)&ch_it_13._M_node[7]._M_next + 3) & 1));
              }
              else {
                ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_558);
                if ((*ppCVar7)->Type != ENET_TextureCoordinate) {
                  pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
                  ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_558);
                  to_string<CX3DImporter_NodeElement::EType>(&local_5c0,(*ppCVar7)->Type);
                  std::operator+(&local_5a0,"Postprocess_BuildMesh. Unknown child of TrianlgeSet: ",
                                 &local_5c0);
                  std::operator+(&local_580,&local_5a0,".");
                  DeadlyImportError::DeadlyImportError(pDVar3,&local_580);
                  __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,
                              DeadlyImportError::~DeadlyImportError);
                }
                paVar6 = *local_20;
                p_Var1 = ch_it_13._M_node + 7;
                p_Var9 = ch_it_13._M_node + 10;
                ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_558);
                MeshGeometry_AddTexCoord
                          (this,paVar6,(vector<int,_std::allocator<int>_> *)&p_Var1->_M_prev,
                           (vector<int,_std::allocator<int>_> *)&p_Var9->_M_prev,
                           (list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                           (*ppCVar7 + 1));
              }
            }
          }
        }
        std::_List_iterator<CX3DImporter_NodeElement_*>::operator++(&local_558);
      }
    }
    else {
      if (pNodeElement->Type != ENET_TriangleStripSet) {
        pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        to_string<CX3DImporter_NodeElement::EType>(&local_6b8,*(EType *)(pMesh_local + 1));
        std::operator+(&local_698,"Postprocess_BuildMesh. Unknown mesh type: ",&local_6b8);
        std::operator+(&local_678,&local_698,".");
        DeadlyImportError::DeadlyImportError(pDVar3,&local_678);
        __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      ch_it_15._M_node = (_List_node_base *)pNodeElement;
      local_5d8._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::begin
                     (&pNodeElement->Child);
      while( true ) {
        ch_it_16 = std::__cxx11::
                   list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
                   end((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                        *)&ch_it_15._M_node[3]._M_prev);
        bVar2 = std::operator!=(&local_5d8,&ch_it_16);
        if (!bVar2) break;
        ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_5d8);
        if ((*ppCVar7)->Type == ENET_Coordinate) {
          p_Var1 = ch_it_15._M_node + 7;
          ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_5d8);
          paVar6 = GeometryHelper_MakeMesh
                             (this,(vector<int,_std::allocator<int>_> *)&p_Var1->_M_prev,
                              (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                              (*ppCVar7 + 1));
          *local_20 = paVar6;
        }
        std::_List_iterator<CX3DImporter_NodeElement_*>::operator++(&local_5d8);
      }
      local_5e8._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::begin
                     ((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                       *)&ch_it_15._M_node[3]._M_prev);
      while( true ) {
        local_5f0._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::end
                       ((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                         *)&ch_it_15._M_node[3]._M_prev);
        bVar2 = std::operator!=(&local_5e8,&local_5f0);
        if (!bVar2) break;
        if (*local_20 == (aiMesh *)0x0) {
          __assert_fail("*pMesh",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/X3D/X3DImporter_Postprocess.cpp"
                        ,0x252,
                        "void Assimp::X3DImporter::Postprocess_BuildMesh(const CX3DImporter_NodeElement &, aiMesh **) const"
                       );
        }
        ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_5e8);
        if ((*ppCVar7)->Type == ENET_Color) {
          paVar6 = *local_20;
          ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_5e8);
          MeshGeometry_AddColor
                    (this,paVar6,(list<aiColor3D,_std::allocator<aiColor3D>_> *)(*ppCVar7 + 1),
                     (bool)(*(byte *)((long)&ch_it_15._M_node[7]._M_next + 2) & 1));
        }
        else {
          ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_5e8);
          if ((*ppCVar7)->Type == ENET_ColorRGBA) {
            paVar6 = *local_20;
            ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_5e8);
            MeshGeometry_AddColor
                      (this,paVar6,
                       (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(*ppCVar7 + 1),
                       (bool)(*(byte *)((long)&ch_it_15._M_node[7]._M_next + 2) & 1));
          }
          else {
            ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_5e8);
            if ((*ppCVar7)->Type != ENET_Coordinate) {
              ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_5e8);
              if ((*ppCVar7)->Type == ENET_Normal) {
                paVar6 = *local_20;
                p_Var1 = ch_it_15._M_node + 7;
                p_Var9 = ch_it_15._M_node + 9;
                ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_5e8);
                MeshGeometry_AddNormal
                          (this,paVar6,(vector<int,_std::allocator<int>_> *)&p_Var1->_M_prev,
                           (vector<int,_std::allocator<int>_> *)p_Var9,
                           (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                           (*ppCVar7 + 1),
                           (bool)(*(byte *)((long)&ch_it_15._M_node[7]._M_next + 3) & 1));
              }
              else {
                ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_5e8);
                if ((*ppCVar7)->Type != ENET_TextureCoordinate) {
                  local_651 = 1;
                  pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
                  ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_5e8);
                  to_string<CX3DImporter_NodeElement::EType>(&local_650,(*ppCVar7)->Type);
                  std::operator+(&local_630,
                                 "Postprocess_BuildMesh. Unknown child of TriangleStripSet: ",
                                 &local_650);
                  std::operator+(&local_610,&local_630,".");
                  DeadlyImportError::DeadlyImportError(pDVar3,&local_610);
                  local_651 = 0;
                  __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,
                              DeadlyImportError::~DeadlyImportError);
                }
                paVar6 = *local_20;
                p_Var1 = ch_it_15._M_node + 7;
                p_Var9 = ch_it_15._M_node + 10;
                ppCVar7 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_5e8);
                MeshGeometry_AddTexCoord
                          (this,paVar6,(vector<int,_std::allocator<int>_> *)&p_Var1->_M_prev,
                           (vector<int,_std::allocator<int>_> *)&p_Var9->_M_prev,
                           (list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                           (*ppCVar7 + 1));
              }
            }
          }
        }
        std::_List_iterator<CX3DImporter_NodeElement_*>::operator++(&local_5e8);
      }
    }
    return;
  }
  tnemesh._6_1_ = 1;
  pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_78,"Postprocess_BuildMesh. *pMesh must be nullptr.",
             (allocator *)((long)&tnemesh + 7));
  DeadlyImportError::DeadlyImportError(pDVar3,&local_78);
  tnemesh._6_1_ = 0;
  __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void X3DImporter::Postprocess_BuildMesh(const CX3DImporter_NodeElement& pNodeElement, aiMesh** pMesh) const
{
	// check argument
	if(pMesh == nullptr) throw DeadlyImportError("Postprocess_BuildMesh. pMesh is nullptr.");
	if(*pMesh != nullptr) throw DeadlyImportError("Postprocess_BuildMesh. *pMesh must be nullptr.");

	/************************************************************************************************************************************/
	/************************************************************ Geometry2D ************************************************************/
	/************************************************************************************************************************************/
	if((pNodeElement.Type == CX3DImporter_NodeElement::ENET_Arc2D) || (pNodeElement.Type == CX3DImporter_NodeElement::ENET_ArcClose2D) ||
		(pNodeElement.Type == CX3DImporter_NodeElement::ENET_Circle2D) || (pNodeElement.Type == CX3DImporter_NodeElement::ENET_Disk2D) ||
		(pNodeElement.Type == CX3DImporter_NodeElement::ENET_Polyline2D) || (pNodeElement.Type == CX3DImporter_NodeElement::ENET_Polypoint2D) ||
		(pNodeElement.Type == CX3DImporter_NodeElement::ENET_Rectangle2D) || (pNodeElement.Type == CX3DImporter_NodeElement::ENET_TriangleSet2D))
	{
		CX3DImporter_NodeElement_Geometry2D& tnemesh = *((CX3DImporter_NodeElement_Geometry2D*)&pNodeElement);// create alias for convenience
		std::vector<aiVector3D> tarr;

		tarr.reserve(tnemesh.Vertices.size());
		for(std::list<aiVector3D>::iterator it = tnemesh.Vertices.begin(); it != tnemesh.Vertices.end(); ++it) tarr.push_back(*it);
		*pMesh = StandardShapes::MakeMesh(tarr, static_cast<unsigned int>(tnemesh.NumIndices));// create mesh from vertices using Assimp help.

		return;// mesh is build, nothing to do anymore.
	}
	/************************************************************************************************************************************/
	/************************************************************ Geometry3D ************************************************************/
	/************************************************************************************************************************************/
	//
	// Predefined figures
	//
	if((pNodeElement.Type == CX3DImporter_NodeElement::ENET_Box) || (pNodeElement.Type == CX3DImporter_NodeElement::ENET_Cone) ||
		(pNodeElement.Type == CX3DImporter_NodeElement::ENET_Cylinder) || (pNodeElement.Type == CX3DImporter_NodeElement::ENET_Sphere))
	{
		CX3DImporter_NodeElement_Geometry3D& tnemesh = *((CX3DImporter_NodeElement_Geometry3D*)&pNodeElement);// create alias for convenience
		std::vector<aiVector3D> tarr;

		tarr.reserve(tnemesh.Vertices.size());
		for(std::list<aiVector3D>::iterator it = tnemesh.Vertices.begin(); it != tnemesh.Vertices.end(); ++it) tarr.push_back(*it);

		*pMesh = StandardShapes::MakeMesh(tarr, static_cast<unsigned int>(tnemesh.NumIndices));// create mesh from vertices using Assimp help.

		return;// mesh is build, nothing to do anymore.
	}
	//
	// Parametric figures
	//
	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_ElevationGrid)
	{
		CX3DImporter_NodeElement_ElevationGrid& tnemesh = *((CX3DImporter_NodeElement_ElevationGrid*)&pNodeElement);// create alias for convenience

		// at first create mesh from existing vertices.
		*pMesh = GeometryHelper_MakeMesh(tnemesh.CoordIdx, tnemesh.Vertices);
		// copy additional information from children
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Color)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_Color*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_ColorRGBA)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_ColorRGBA*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Normal)
				MeshGeometry_AddNormal(**pMesh,  ((CX3DImporter_NodeElement_Normal*)*ch_it)->Value, tnemesh.NormalPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_TextureCoordinate)
				MeshGeometry_AddTexCoord(**pMesh, ((CX3DImporter_NodeElement_TextureCoordinate*)*ch_it)->Value);
			else
				throw DeadlyImportError("Postprocess_BuildMesh. Unknown child of ElevationGrid: " + to_string((*ch_it)->Type) + ".");
		}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)

		return;// mesh is build, nothing to do anymore.
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_ElevationGrid)
	//
	// Indexed primitives sets
	//
	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_IndexedFaceSet)
	{
		CX3DImporter_NodeElement_IndexedSet& tnemesh = *((CX3DImporter_NodeElement_IndexedSet*)&pNodeElement);// create alias for convenience

		// at first search for <Coordinate> node and create mesh.
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
			{
				*pMesh = GeometryHelper_MakeMesh(tnemesh.CoordIndex, ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value);
			}
		}

		// copy additional information from children
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Color)
				MeshGeometry_AddColor(**pMesh, tnemesh.CoordIndex, tnemesh.ColorIndex, ((CX3DImporter_NodeElement_Color*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_ColorRGBA)
				MeshGeometry_AddColor(**pMesh, tnemesh.CoordIndex, tnemesh.ColorIndex, ((CX3DImporter_NodeElement_ColorRGBA*)*ch_it)->Value,
										tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
				{} // skip because already read when mesh created.
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Normal)
				MeshGeometry_AddNormal(**pMesh, tnemesh.CoordIndex, tnemesh.NormalIndex, ((CX3DImporter_NodeElement_Normal*)*ch_it)->Value,
										tnemesh.NormalPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_TextureCoordinate)
				MeshGeometry_AddTexCoord(**pMesh, tnemesh.CoordIndex, tnemesh.TexCoordIndex, ((CX3DImporter_NodeElement_TextureCoordinate*)*ch_it)->Value);
			else
				throw DeadlyImportError("Postprocess_BuildMesh. Unknown child of IndexedFaceSet: " + to_string((*ch_it)->Type) + ".");
		}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)

		return;// mesh is build, nothing to do anymore.
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_IndexedFaceSet)

	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_IndexedLineSet)
	{
		CX3DImporter_NodeElement_IndexedSet& tnemesh = *((CX3DImporter_NodeElement_IndexedSet*)&pNodeElement);// create alias for convenience

		// at first search for <Coordinate> node and create mesh.
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
			{
				*pMesh = GeometryHelper_MakeMesh(tnemesh.CoordIndex, ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value);
			}
		}

		// copy additional information from children
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			ai_assert(*pMesh);
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Color)
				MeshGeometry_AddColor(**pMesh, tnemesh.CoordIndex, tnemesh.ColorIndex, ((CX3DImporter_NodeElement_Color*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_ColorRGBA)
				MeshGeometry_AddColor(**pMesh, tnemesh.CoordIndex, tnemesh.ColorIndex, ((CX3DImporter_NodeElement_ColorRGBA*)*ch_it)->Value,
										tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
				{} // skip because already read when mesh created.
			else
				throw DeadlyImportError("Postprocess_BuildMesh. Unknown child of IndexedLineSet: " + to_string((*ch_it)->Type) + ".");
		}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)

		return;// mesh is build, nothing to do anymore.
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_IndexedLineSet)

	if((pNodeElement.Type == CX3DImporter_NodeElement::ENET_IndexedTriangleSet) ||
		(pNodeElement.Type == CX3DImporter_NodeElement::ENET_IndexedTriangleFanSet) ||
		(pNodeElement.Type == CX3DImporter_NodeElement::ENET_IndexedTriangleStripSet))
	{
		CX3DImporter_NodeElement_IndexedSet& tnemesh = *((CX3DImporter_NodeElement_IndexedSet*)&pNodeElement);// create alias for convenience

		// at first search for <Coordinate> node and create mesh.
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
			{
				*pMesh = GeometryHelper_MakeMesh(tnemesh.CoordIndex, ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value);
			}
		}

		// copy additional information from children
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			ai_assert(*pMesh);
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Color)
				MeshGeometry_AddColor(**pMesh, tnemesh.CoordIndex, tnemesh.ColorIndex, ((CX3DImporter_NodeElement_Color*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_ColorRGBA)
				MeshGeometry_AddColor(**pMesh, tnemesh.CoordIndex, tnemesh.ColorIndex, ((CX3DImporter_NodeElement_ColorRGBA*)*ch_it)->Value,
										tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
				{} // skip because already read when mesh created.
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Normal)
				MeshGeometry_AddNormal(**pMesh, tnemesh.CoordIndex, tnemesh.NormalIndex, ((CX3DImporter_NodeElement_Normal*)*ch_it)->Value,
										tnemesh.NormalPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_TextureCoordinate)
				MeshGeometry_AddTexCoord(**pMesh, tnemesh.CoordIndex, tnemesh.TexCoordIndex, ((CX3DImporter_NodeElement_TextureCoordinate*)*ch_it)->Value);
			else
				throw DeadlyImportError("Postprocess_BuildMesh. Unknown child of IndexedTriangleSet or IndexedTriangleFanSet, or \
																	IndexedTriangleStripSet: " + to_string((*ch_it)->Type) + ".");
		}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)

		return;// mesh is build, nothing to do anymore.
	}// if((pNodeElement.Type == CX3DImporter_NodeElement::ENET_IndexedTriangleFanSet) || (pNodeElement.Type == CX3DImporter_NodeElement::ENET_IndexedTriangleStripSet))

	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_Extrusion)
	{
		CX3DImporter_NodeElement_IndexedSet& tnemesh = *((CX3DImporter_NodeElement_IndexedSet*)&pNodeElement);// create alias for convenience

		*pMesh = GeometryHelper_MakeMesh(tnemesh.CoordIndex, tnemesh.Vertices);

		return;// mesh is build, nothing to do anymore.
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_Extrusion)

	//
	// Primitives sets
	//
	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_PointSet)
	{
		CX3DImporter_NodeElement_Set& tnemesh = *((CX3DImporter_NodeElement_Set*)&pNodeElement);// create alias for convenience

		// at first search for <Coordinate> node and create mesh.
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
			{
				std::vector<aiVector3D> vec_copy;

				vec_copy.reserve(((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value.size());
				for(std::list<aiVector3D>::const_iterator it = ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value.begin();
					it != ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value.end(); ++it)
				{
					vec_copy.push_back(*it);
				}

				*pMesh = StandardShapes::MakeMesh(vec_copy, 1);
			}
		}

		// copy additional information from children
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			ai_assert(*pMesh);
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Color)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_Color*)*ch_it)->Value, true);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_ColorRGBA)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_ColorRGBA*)*ch_it)->Value, true);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
				{} // skip because already read when mesh created.
			else
				throw DeadlyImportError("Postprocess_BuildMesh. Unknown child of PointSet: " + to_string((*ch_it)->Type) + ".");
		}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)

		return;// mesh is build, nothing to do anymore.
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_PointSet)

	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_LineSet)
	{
		CX3DImporter_NodeElement_Set& tnemesh = *((CX3DImporter_NodeElement_Set*)&pNodeElement);// create alias for convenience

		// at first search for <Coordinate> node and create mesh.
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
			{
				*pMesh = GeometryHelper_MakeMesh(tnemesh.CoordIndex, ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value);
			}
		}

		// copy additional information from children
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			ai_assert(*pMesh);
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Color)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_Color*)*ch_it)->Value, true);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_ColorRGBA)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_ColorRGBA*)*ch_it)->Value, true);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
				{} // skip because already read when mesh created.
			else
				throw DeadlyImportError("Postprocess_BuildMesh. Unknown child of LineSet: " + to_string((*ch_it)->Type) + ".");
		}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)

		return;// mesh is build, nothing to do anymore.
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_LineSet)

	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_TriangleFanSet)
	{
		CX3DImporter_NodeElement_Set& tnemesh = *((CX3DImporter_NodeElement_Set*)&pNodeElement);// create alias for convenience

		// at first search for <Coordinate> node and create mesh.
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
			{
				*pMesh = GeometryHelper_MakeMesh(tnemesh.CoordIndex, ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value);
			}
		}

		// copy additional information from children
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if ( nullptr == *pMesh ) {
				break;
			}
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Color)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_Color*)*ch_it)->Value,tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_ColorRGBA)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_ColorRGBA*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
				{} // skip because already read when mesh created.
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Normal)
				MeshGeometry_AddNormal(**pMesh, tnemesh.CoordIndex, tnemesh.NormalIndex, ((CX3DImporter_NodeElement_Normal*)*ch_it)->Value,
										tnemesh.NormalPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_TextureCoordinate)
				MeshGeometry_AddTexCoord(**pMesh, tnemesh.CoordIndex, tnemesh.TexCoordIndex, ((CX3DImporter_NodeElement_TextureCoordinate*)*ch_it)->Value);
			else
				throw DeadlyImportError("Postprocess_BuildMesh. Unknown child of TrianlgeFanSet: " + to_string((*ch_it)->Type) + ".");
		}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)

		return;// mesh is build, nothing to do anymore.
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_TriangleFanSet)

	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_TriangleSet)
	{
		CX3DImporter_NodeElement_Set& tnemesh = *((CX3DImporter_NodeElement_Set*)&pNodeElement);// create alias for convenience

		// at first search for <Coordinate> node and create mesh.
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
			{
				std::vector<aiVector3D> vec_copy;

				vec_copy.reserve(((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value.size());
				for(std::list<aiVector3D>::const_iterator it = ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value.begin();
					it != ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value.end(); ++it)
				{
					vec_copy.push_back(*it);
				}

				*pMesh = StandardShapes::MakeMesh(vec_copy, 3);
			}
		}

		// copy additional information from children
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			ai_assert(*pMesh);
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Color)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_Color*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_ColorRGBA)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_ColorRGBA*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
				{} // skip because already read when mesh created.
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Normal)
				MeshGeometry_AddNormal(**pMesh, tnemesh.CoordIndex, tnemesh.NormalIndex, ((CX3DImporter_NodeElement_Normal*)*ch_it)->Value,
										tnemesh.NormalPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_TextureCoordinate)
				MeshGeometry_AddTexCoord(**pMesh, tnemesh.CoordIndex, tnemesh.TexCoordIndex, ((CX3DImporter_NodeElement_TextureCoordinate*)*ch_it)->Value);
			else
				throw DeadlyImportError("Postprocess_BuildMesh. Unknown child of TrianlgeSet: " + to_string((*ch_it)->Type) + ".");
		}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)

		return;// mesh is build, nothing to do anymore.
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_TriangleSet)

	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_TriangleStripSet)
	{
		CX3DImporter_NodeElement_Set& tnemesh = *((CX3DImporter_NodeElement_Set*)&pNodeElement);// create alias for convenience

		// at first search for <Coordinate> node and create mesh.
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
			{
				*pMesh = GeometryHelper_MakeMesh(tnemesh.CoordIndex, ((CX3DImporter_NodeElement_Coordinate*)*ch_it)->Value);
			}
		}

		// copy additional information from children
		for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)
		{
			ai_assert(*pMesh);
			if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Color)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_Color*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_ColorRGBA)
				MeshGeometry_AddColor(**pMesh, ((CX3DImporter_NodeElement_ColorRGBA*)*ch_it)->Value, tnemesh.ColorPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Coordinate)
				{} // skip because already read when mesh created.
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_Normal)
				MeshGeometry_AddNormal(**pMesh, tnemesh.CoordIndex, tnemesh.NormalIndex, ((CX3DImporter_NodeElement_Normal*)*ch_it)->Value,
										tnemesh.NormalPerVertex);
			else if((*ch_it)->Type == CX3DImporter_NodeElement::ENET_TextureCoordinate)
				MeshGeometry_AddTexCoord(**pMesh, tnemesh.CoordIndex, tnemesh.TexCoordIndex, ((CX3DImporter_NodeElement_TextureCoordinate*)*ch_it)->Value);
			else
				throw DeadlyImportError("Postprocess_BuildMesh. Unknown child of TriangleStripSet: " + to_string((*ch_it)->Type) + ".");
		}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = tnemesh.Child.begin(); ch_it != tnemesh.Child.end(); ++ch_it)

		return;// mesh is build, nothing to do anymore.
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_TriangleStripSet)

	throw DeadlyImportError("Postprocess_BuildMesh. Unknown mesh type: " + to_string(pNodeElement.Type) + ".");
}